

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O1

vm_obj_id_t CVmObjTimeZone::create(CVmTimeZone *tz)

{
  vm_obj_id_t obj_id;
  int iVar1;
  undefined8 *puVar2;
  undefined4 extraout_var;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,0,0);
  puVar2 = (undefined8 *)CVmObject::operator_new(0x10,obj_id);
  *puVar2 = &PTR_get_metaclass_reg_0036c928;
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,8,puVar2);
  *(undefined8 *)CONCAT44(extraout_var,iVar1) = tz;
  puVar2[1] = (undefined8 *)CONCAT44(extraout_var,iVar1);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjTimeZone::create(VMG_ CVmTimeZone *tz)
{
    /* allocate the object ID and create the object */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
    new (vmg_ id) CVmObjTimeZone(vmg_ tz);

    /* return the new ID */
    return id;
}